

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

bool GUIComponentSave(string *path,vector<GUIComponent,_std::allocator<GUIComponent>_> *components)

{
  pointer pGVar1;
  char cVar2;
  char cVar3;
  ostream *poVar4;
  long lVar5;
  GUIComponent *component;
  pointer pGVar6;
  char *pcVar7;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)path,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    pGVar1 = (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pGVar6 = (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>).
                  _M_impl.super__Vector_impl_data._M_start; pGVar6 != pGVar1; pGVar6 = pGVar6 + 1) {
      switch(pGVar6->Type) {
      case EGUIComponentTypeSlider1:
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(pGVar6->UniformName)._M_dataplus._M_p,
                            (pGVar6->UniformName)._M_string_length);
        lVar5 = 0x34;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," s1 ",4);
        break;
      case EGUIComponentTypeSlider2:
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(pGVar6->UniformName)._M_dataplus._M_p,
                            (pGVar6->UniformName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," s2 ",4);
        poVar4 = std::ostream::_M_insert<double>((double)pGVar6->Data[0]);
        lVar5 = 0x38;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        break;
      case EGUIComponentTypeSlider3:
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(pGVar6->UniformName)._M_dataplus._M_p,
                            (pGVar6->UniformName)._M_string_length);
        pcVar7 = " s3 ";
        goto LAB_001183d4;
      case EGUIComponentTypeSlider4:
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(pGVar6->UniformName)._M_dataplus._M_p,
                            (pGVar6->UniformName)._M_string_length);
        pcVar7 = " s4 ";
        goto LAB_001184a9;
      case EGUIComponentTypeColor3:
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(pGVar6->UniformName)._M_dataplus._M_p,
                            (pGVar6->UniformName)._M_string_length);
        pcVar7 = " c3 ";
LAB_001183d4:
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,4);
        poVar4 = std::ostream::_M_insert<double>((double)pGVar6->Data[0]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>((double)pGVar6->Data[1]);
        lVar5 = 0x3c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        break;
      case EGUIComponentTypeColor4:
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(pGVar6->UniformName)._M_dataplus._M_p,
                            (pGVar6->UniformName)._M_string_length);
        pcVar7 = " c4 ";
LAB_001184a9:
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,4);
        poVar4 = std::ostream::_M_insert<double>((double)pGVar6->Data[0]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>((double)pGVar6->Data[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>((double)pGVar6->Data[2]);
        lVar5 = 0x40;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        break;
      default:
        goto switchD_00118374_default;
      }
      std::ostream::_M_insert<double>((double)*(float *)((long)pGVar6->Data + lVar5 + -0x34));
      cVar2 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
switchD_00118374_default:
    }
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (bool)cVar3;
}

Assistant:

bool GUIComponentSave(const std::string& path, const std::vector<GUIComponent>& components) {
    std::ofstream file(path);
    
    if (!file.is_open()) {
        return false;
    }
    
    for (const GUIComponent& component : components) {
        switch (component.Type) {
            case EGUIComponentTypeSlider1:
                file << component.UniformName << " s1 ";
                file << component.Data[0];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider2:
                file << component.UniformName << " s2 ";
                file << component.Data[0] << " ";
                file << component.Data[1];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider3:
                file << component.UniformName << " s3 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider4:
                file << component.UniformName << " s4 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2] << " ";
                file << component.Data[3];
                file << std::endl;
                break;
            case EGUIComponentTypeColor3:
                file << component.UniformName << " c3 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2];
                file << std::endl;
                break;
            case EGUIComponentTypeColor4:
                file << component.UniformName << " c4 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2] << " ";
                file << component.Data[3];
                file << std::endl;
                break;
        }
    }
    
    file.close();
    return true;
}